

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

opStatus __thiscall
llvm::detail::IEEEFloat::divide(IEEEFloat *this,IEEEFloat *rhs,roundingMode rounding_mode)

{
  opStatus oVar1;
  lostFraction lost_fraction;
  opStatus oVar2;
  
  this->field_0x12 = this->field_0x12 ^ rhs->field_0x12 & 8;
  oVar1 = divideSpecials(this,rhs);
  if ((this->field_0x12 & 7) != 3 && (this->field_0x12 & 6) != 0) {
    lost_fraction = divideSignificand(this,rhs);
    oVar2 = normalize(this,rounding_mode,lost_fraction);
    oVar1 = oVar2 | opInexact;
    if (lost_fraction == lfExactlyZero) {
      oVar1 = oVar2;
    }
  }
  return oVar1;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::divide(const IEEEFloat &rhs,
                                      roundingMode rounding_mode) {
  opStatus fs;

  sign ^= rhs.sign;
  fs = divideSpecials(rhs);

  if (isFiniteNonZero()) {
    lostFraction lost_fraction = divideSignificand(rhs);
    fs = normalize(rounding_mode, lost_fraction);
    if (lost_fraction != lfExactlyZero)
      fs = (opStatus) (fs | opInexact);
  }

  return fs;
}